

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O2

void testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>
               (Stack<wasm::analysis::Flat<unsigned_int>_> *lattice,Element *bot,Element *a,
               Element *b,Element *top)

{
  Stack<wasm::analysis::Flat<unsigned_int>_> *local_38;
  anon_class_8_1_809a3e96 test;
  
  local_38 = lattice;
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>(wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,bot,bot,bot);
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>(wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,bot,a,a);
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>(wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,bot,b,b);
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>(wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,bot,top,top);
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>(wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,a,bot,a);
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>(wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,a,a,a);
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>(wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,a,b,top);
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>(wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,a,top,top);
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>(wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,b,bot,b);
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>(wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,b,a,top);
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>(wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,b,b,b);
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>(wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,b,top,top);
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>(wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,top,bot,top);
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>(wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,top,a,top);
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>(wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,top,b,top);
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>(wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&,wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>::Element_const&)
  ::{lambda(auto:1_const&,auto:2_const&,auto:3_const&)#1}::operator()
            ((_lambda_auto_1_const__auto_2_const__auto_3_const___1_ *)&local_38,top,top,top);
  return;
}

Assistant:

void testDiamondJoin(const L& lattice,
                     const typename L::Element& bot,
                     const typename L::Element& a,
                     const typename L::Element& b,
                     const typename L::Element& top) {

  auto test =
    [&](const auto& joinee, const auto& joiner, const auto& expected) {
      auto copy = joinee;
      EXPECT_EQ(lattice.join(copy, joiner), joinee != expected);
      EXPECT_EQ(copy, expected);
    };

  test(bot, bot, bot);
  test(bot, a, a);
  test(bot, b, b);
  test(bot, top, top);

  test(a, bot, a);
  test(a, a, a);
  test(a, b, top);
  test(a, top, top);

  test(b, bot, b);
  test(b, a, top);
  test(b, b, b);
  test(b, top, top);

  test(top, bot, top);
  test(top, a, top);
  test(top, b, top);
  test(top, top, top);
}